

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O1

void __thiscall QGridLayout::setGeometry(QGridLayout *this,QRect *rect)

{
  QGridLayoutPrivate *this_00;
  int hSpacing;
  int vSpacing;
  undefined1 auVar1 [16];
  QRect r;
  
  this_00 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  if ((this_00->field_0x194 & 4) == 0) {
    auVar1 = (**(code **)(*(long *)&this->super_QLayout + 0x78))(this);
    if (((((rect->x1).m_i == auVar1._0_4_) && ((rect->x2).m_i == auVar1._8_4_)) &&
        ((rect->y1).m_i == auVar1._4_4_)) && ((rect->y2).m_i == auVar1._12_4_)) {
      return;
    }
  }
  if ((this->super_QLayout).super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
      super_QFlagsStorage<Qt::AlignmentFlag>.i == 0) {
    r = *rect;
  }
  else {
    r = QLayout::alignmentRect(&this->super_QLayout,rect);
  }
  hSpacing = *(int *)(*(long *)&(this->super_QLayout).field_0x8 + 0x17c);
  if (hSpacing < 0) {
    hSpacing = qSmartSpacing(&this->super_QLayout,PM_LayoutHorizontalSpacing);
  }
  vSpacing = *(int *)(*(long *)&(this->super_QLayout).field_0x8 + 0x180);
  if (vSpacing < 0) {
    vSpacing = qSmartSpacing(&this->super_QLayout,PM_LayoutVerticalSpacing);
  }
  QGridLayoutPrivate::distribute(this_00,r,hSpacing,vSpacing);
  QLayout::setGeometry(&this->super_QLayout,rect);
  return;
}

Assistant:

void QGridLayout::setGeometry(const QRect &rect)
{
    Q_D(QGridLayout);
    if (d->isDirty() || rect != geometry()) {
        QRect cr = alignment() ? alignmentRect(rect) : rect;
        d->distribute(cr, horizontalSpacing(), verticalSpacing());
        QLayout::setGeometry(rect);
    }
}